

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

hugeint_t duckdb::VectorTryCastStringOperator<duckdb::TryCastToUUID>::
          Operation<duckdb::string_t,duckdb::hugeint_t>
                    (string_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  hugeint_t *result;
  CastParameters *in_R9;
  hugeint_t hVar2;
  string_t input_00;
  string_t input_01;
  hugeint_t output;
  hugeint_t local_60;
  string local_50;
  
  input_01.value._0_8_ = input.value._8_8_;
  result = *dataptr;
  input_01.value.pointer.ptr = (char *)&local_60;
  bVar1 = TryCastToUUID::Operation<duckdb::string_t,duckdb::hugeint_t>
                    (input.value._0_8_,input_01,result,*(Vector **)((long)dataptr + 8),in_R9);
  if (!bVar1) {
    input_00.value.pointer.ptr = (char *)result;
    input_00.value._0_8_ = input_01.value._0_8_;
    CastExceptionText<duckdb::string_t,duckdb::hugeint_t>
              (&local_50,(duckdb *)input.value._0_8_,input_00);
    hVar2 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                      (&local_50,mask,idx,(VectorTryCastData *)dataptr);
    ::std::__cxx11::string::~string((string *)&local_50);
    local_60 = hVar2;
  }
  return local_60;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(
		        OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->result, data->parameters))) {
			return output;
		}
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}